

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.hpp
# Opt level: O0

string * tf::get_env(string *str)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  char *ptr;
  allocator<char> *in_stack_ffffffffffffffe0;
  
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = getenv(pcVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RSI,pcVar1,in_stack_ffffffffffffffe0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe7);
  return in_RDI;
}

Assistant:

inline std::string get_env(const std::string& str) {
#ifdef _MSC_VER
  char *ptr = nullptr;
  size_t len = 0;

  if(_dupenv_s(&ptr, &len, str.c_str()) == 0 && ptr != nullptr) {
    std::string res(ptr, len);
    std::free(ptr);
    return res;
  }
  return "";

#else
  auto ptr = std::getenv(str.c_str());
  return ptr ? ptr : "";
#endif
}